

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeReader::Create
          (ByteCodeReader *this,byte *byteCodeStart,uint startOffset,uint byteCodeLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (byteCodeStart == (byte *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x16,"(byteCodeStart != nullptr)",
                                "Must have valid byte-code to read");
    if (!bVar2) goto LAB_00837e70;
    *puVar3 = 0;
  }
  this->m_startLocation = byteCodeStart;
  this->m_currentLocation = byteCodeStart + startOffset;
  this->m_endLocation = byteCodeStart + byteCodeLength;
  if (byteCodeStart + byteCodeLength < byteCodeStart + startOffset) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x1d,"(m_currentLocation <= m_endLocation)",
                                "m_currentLocation <= m_endLocation");
    if (!bVar2) {
LAB_00837e70:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeReader::Create(const byte * byteCodeStart, uint startOffset)
#endif
    {
        AssertMsg(byteCodeStart != nullptr, "Must have valid byte-code to read");

        m_startLocation = byteCodeStart;
        m_currentLocation = m_startLocation + startOffset;

#if DBG
        m_endLocation = m_startLocation + byteCodeLength;
        Assert(m_currentLocation <= m_endLocation);
#endif
    }